

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_mesh * rf_gen_mesh_cubicmap
                    (rf_mesh *__return_storage_ptr__,rf_image cubicmap,rf_vec3 cube_size,
                    rf_allocator allocator,rf_allocator temp_allocator)

{
  undefined8 *puVar1;
  rf_source_location rVar2;
  rf_source_location rVar3;
  rf_source_location rVar4;
  rf_source_location rVar5;
  rf_source_location rVar6;
  rf_source_location rVar7;
  rf_source_location rVar8;
  rf_source_location rVar9;
  rf_source_location rVar10;
  rf_source_location rVar11;
  rf_source_location rVar12;
  rf_allocator_args rVar13;
  rf_allocator_args rVar14;
  rf_allocator_args rVar15;
  rf_allocator_args rVar16;
  rf_allocator_args rVar17;
  undefined1 auVar18 [24];
  undefined1 auVar19 [24];
  undefined1 auVar20 [24];
  undefined1 auVar21 [24];
  undefined1 auVar22 [24];
  undefined1 auVar23 [24];
  uint *puVar24;
  rf_color *prVar25;
  void *pvVar26;
  void *pvVar27;
  void *pvVar28;
  ulong uVar29;
  float *pfVar30;
  float *pfVar31;
  float *pfVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  uint uVar36;
  long lVar37;
  uint uVar38;
  long lVar39;
  uint uVar40;
  uint uVar41;
  rf_int x;
  ulong uVar42;
  uint uVar43;
  long lVar44;
  ulong uVar45;
  long lVar46;
  bool bVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  ulong local_2e8;
  long local_2a8;
  rf_allocator temp_allocator_local;
  uint uStack_254;
  uint uStack_224;
  uint uStack_1f4;
  uint uStack_1c4;
  uint uStack_194;
  uint uStack_164;
  uint uStack_134;
  uint uStack_104;
  uint uStack_d4;
  uint uStack_a4;
  uint uStack_74;
  float local_58;
  float fStack_54;
  rf_allocator allocator_local;
  
  temp_allocator_local.user_data = temp_allocator.user_data;
  allocator_local.allocator_proc = allocator.allocator_proc;
  allocator_local.user_data = allocator.user_data;
  __return_storage_ptr__->bone_ids = (int *)0x0;
  __return_storage_ptr__->bone_weights = (float *)0x0;
  __return_storage_ptr__->anim_vertices = (float *)0x0;
  __return_storage_ptr__->anim_normals = (float *)0x0;
  __return_storage_ptr__->colors = (uchar *)0x0;
  __return_storage_ptr__->indices = (unsigned_short *)0x0;
  __return_storage_ptr__->normals = (float *)0x0;
  __return_storage_ptr__->tangents = (float *)0x0;
  __return_storage_ptr__->texcoords = (float *)0x0;
  __return_storage_ptr__->texcoords2 = (float *)0x0;
  __return_storage_ptr__->vertex_count = 0;
  __return_storage_ptr__->triangle_count = 0;
  __return_storage_ptr__->vertices = (float *)0x0;
  *(undefined8 *)&__return_storage_ptr__->vao_id = 0;
  rVar2.proc_name = "rf_gen_mesh_cubicmap";
  rVar2.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar2.line_in_file = 0x898b;
  rVar13._16_8_ = (ulong)uStack_74 << 0x20;
  rVar13.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0x1c) << 0x40,0);
  rVar13.size_to_allocate_or_reallocate = SUB168(ZEXT816(0x1c) << 0x40,8);
  temp_allocator_local.allocator_proc = temp_allocator.allocator_proc;
  puVar24 = (uint *)(*allocator_local.allocator_proc)(&allocator_local,rVar2,RF_AM_ALLOC,rVar13);
  __return_storage_ptr__->vbo_id = puVar24;
  puVar24[0] = 0;
  puVar24[1] = 0;
  puVar24[2] = 0;
  puVar24[3] = 0;
  puVar24[3] = 0;
  puVar24[4] = 0;
  puVar24[5] = 0;
  puVar24[6] = 0;
  prVar25 = rf_image_pixels_to_rgba32(cubicmap,temp_allocator);
  fStack_54 = cube_size.y;
  lVar44 = (long)(cubicmap.width * cubicmap.height * 0x24);
  lVar37 = lVar44 * 0xc;
  rVar3.proc_name = "rf_gen_mesh_cubicmap";
  rVar3.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar3.line_in_file = 0x899e;
  auVar18._8_8_ = (ulong)uStack_a4 << 0x20;
  auVar18._0_8_ = lVar37;
  auVar18._16_8_ = 0;
  pvVar26 = (*temp_allocator.allocator_proc)
                      (&temp_allocator_local,rVar3,RF_AM_ALLOC,(rf_allocator_args)(auVar18 << 0x40))
  ;
  rVar4.proc_name = "rf_gen_mesh_cubicmap";
  rVar4.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar4.line_in_file = 0x899f;
  auVar19._8_8_ = (ulong)uStack_d4 << 0x20;
  auVar19._0_8_ = lVar44 << 3;
  auVar19._16_8_ = 0;
  pvVar27 = (*temp_allocator_local.allocator_proc)
                      (&temp_allocator_local,rVar4,RF_AM_ALLOC,(rf_allocator_args)(auVar19 << 0x40))
  ;
  rVar5.proc_name = "rf_gen_mesh_cubicmap";
  rVar5.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar5.line_in_file = 0x89a0;
  auVar20._8_8_ = (ulong)uStack_104 << 0x20;
  auVar20._0_8_ = lVar37;
  auVar20._16_8_ = 0;
  pvVar28 = (*temp_allocator_local.allocator_proc)
                      (&temp_allocator_local,rVar5,RF_AM_ALLOC,(rf_allocator_args)(auVar20 << 0x40))
  ;
  uVar29 = 0;
  uVar35 = (ulong)(uint)cubicmap.width;
  if (cubicmap.width < 1) {
    uVar35 = uVar29;
  }
  uVar45 = (ulong)(uint)cubicmap.height;
  if (cubicmap.height < 1) {
    uVar45 = uVar29;
  }
  local_2a8 = 4;
  lVar37 = -4;
  uVar43 = 0;
  local_2e8 = 0;
  uVar36 = 0;
  uVar33 = 0;
  do {
    if (uVar33 == uVar45) {
      __return_storage_ptr__->vertex_count = uVar36;
      __return_storage_ptr__->triangle_count = (int)uVar36 / 3;
      lVar37 = (long)(int)(uVar36 * 3) << 2;
      rVar6.proc_name = "rf_gen_mesh_cubicmap";
      rVar6.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar6.line_in_file = 0x8ac1;
      auVar21._8_8_ = (ulong)uStack_134 << 0x20;
      auVar21._0_8_ = lVar37;
      auVar21._16_8_ = 0;
      pfVar30 = (float *)(*allocator_local.allocator_proc)
                                   (&allocator_local,rVar6,RF_AM_ALLOC,
                                    (rf_allocator_args)(auVar21 << 0x40));
      __return_storage_ptr__->vertices = pfVar30;
      rVar7.proc_name = "rf_gen_mesh_cubicmap";
      rVar7.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar7.line_in_file = 0x8ac2;
      auVar22._8_8_ = (ulong)uStack_164 << 0x20;
      auVar22._0_8_ = lVar37;
      auVar22._16_8_ = 0;
      pfVar31 = (float *)(*allocator_local.allocator_proc)
                                   (&allocator_local,rVar7,RF_AM_ALLOC,
                                    (rf_allocator_args)(auVar22 << 0x40));
      __return_storage_ptr__->normals = pfVar31;
      rVar8.proc_name = "rf_gen_mesh_cubicmap";
      rVar8.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar8.line_in_file = 0x8ac3;
      auVar23._8_8_ = (ulong)uStack_194 << 0x20;
      auVar23._0_8_ = (long)(int)(uVar36 * 2) << 2;
      auVar23._16_8_ = 0;
      pfVar32 = (float *)(*allocator_local.allocator_proc)
                                   (&allocator_local,rVar8,RF_AM_ALLOC,
                                    (rf_allocator_args)(auVar23 << 0x40));
      __return_storage_ptr__->texcoords = pfVar32;
      __return_storage_ptr__->colors = (uchar *)0x0;
      uVar29 = 0;
      uVar35 = (ulong)uVar36;
      if ((int)uVar36 < 1) {
        uVar35 = uVar29;
      }
      for (; uVar35 * 0xc - uVar29 != 0; uVar29 = uVar29 + 0xc) {
        *(undefined4 *)((long)pfVar30 + uVar29) = *(undefined4 *)((long)pvVar26 + uVar29);
        *(undefined4 *)((long)pfVar30 + uVar29 + 4) = *(undefined4 *)((long)pvVar26 + uVar29 + 4);
        *(undefined4 *)((long)pfVar30 + uVar29 + 8) = *(undefined4 *)((long)pvVar26 + uVar29 + 8);
      }
      uVar29 = 0;
      uVar35 = (ulong)uVar43;
      if ((int)uVar43 < 1) {
        uVar35 = uVar29;
      }
      for (; uVar35 * 0xc - uVar29 != 0; uVar29 = uVar29 + 0xc) {
        *(undefined4 *)((long)pfVar31 + uVar29) = *(undefined4 *)((long)pvVar28 + uVar29);
        *(undefined4 *)((long)pfVar31 + uVar29 + 4) = *(undefined4 *)((long)pvVar28 + uVar29 + 4);
        *(undefined4 *)((long)pfVar31 + uVar29 + 8) = *(undefined4 *)((long)pvVar28 + uVar29 + 8);
      }
      uVar35 = 0;
      if ((int)local_2e8 < 1) {
        local_2e8 = uVar35;
      }
      for (; local_2e8 != uVar35; uVar35 = uVar35 + 1) {
        pfVar32[uVar35 * 2] = *(float *)((long)pvVar27 + uVar35 * 8);
        pfVar32[uVar35 * 2 + 1] = *(float *)((long)pvVar27 + uVar35 * 8 + 4);
      }
      rVar9.proc_name = "rf_gen_mesh_cubicmap";
      rVar9.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar9.line_in_file = 0x8ae6;
      rVar14.size_to_allocate_or_reallocate = 0;
      rVar14.pointer_to_free_or_realloc = pvVar26;
      rVar14._16_8_ = (ulong)uStack_1c4 << 0x20;
      (*temp_allocator_local.allocator_proc)(&temp_allocator_local,rVar9,RF_AM_FREE,rVar14);
      rVar10.proc_name = "rf_gen_mesh_cubicmap";
      rVar10.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar10.line_in_file = 0x8ae7;
      rVar15.size_to_allocate_or_reallocate = 0;
      rVar15.pointer_to_free_or_realloc = pvVar28;
      rVar15._16_8_ = (ulong)uStack_1f4 << 0x20;
      (*temp_allocator_local.allocator_proc)(&temp_allocator_local,rVar10,RF_AM_FREE,rVar15);
      rVar11.proc_name = "rf_gen_mesh_cubicmap";
      rVar11.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar11.line_in_file = 0x8ae8;
      rVar16.size_to_allocate_or_reallocate = 0;
      rVar16.pointer_to_free_or_realloc = pvVar27;
      rVar16._16_8_ = (ulong)uStack_224 << 0x20;
      (*temp_allocator_local.allocator_proc)(&temp_allocator_local,rVar11,RF_AM_FREE,rVar16);
      rVar12.proc_name = "rf_gen_mesh_cubicmap";
      rVar12.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar12.line_in_file = 0x8aea;
      rVar17.size_to_allocate_or_reallocate = 0;
      rVar17.pointer_to_free_or_realloc = prVar25;
      rVar17._16_8_ = (ulong)uStack_254 << 0x20;
      (*temp_allocator_local.allocator_proc)(&temp_allocator_local,rVar12,RF_AM_FREE,rVar17);
      rf_gfx_load_mesh(__return_storage_ptr__,false);
      return __return_storage_ptr__;
    }
    fVar50 = ((float)(long)uVar33 + -0.5) * cube_size.z;
    fVar49 = ((float)(long)uVar33 + 0.5) * cube_size.z;
    for (uVar42 = 0; uVar35 != uVar42; uVar42 = uVar42 + 1) {
      local_58 = cube_size.x;
      fVar48 = ((float)(long)uVar42 + -0.5) * local_58;
      local_58 = ((float)(long)uVar42 + 0.5) * local_58;
      lVar44 = uVar29 * (long)cubicmap.width;
      lVar46 = (long)(int)local_2e8;
      if ((&prVar25[uVar42].r)[lVar44] == '\0') {
        if (((&prVar25[uVar42].g)[lVar44] == '\0') && ((&prVar25[uVar42].b)[lVar44] == '\0')) {
          lVar44 = (long)(int)uVar36 * 0xc;
          *(float *)((long)pvVar26 + lVar44) = fVar48;
          *(float *)((long)pvVar26 + lVar44 + 4) = fStack_54;
          *(float *)((long)pvVar26 + lVar44 + 8) = fVar50;
          *(float *)((long)pvVar26 + lVar44 + 0xc) = local_58;
          *(float *)((long)pvVar26 + lVar44 + 0x10) = fStack_54;
          *(float *)((long)pvVar26 + lVar44 + 0x14) = fVar49;
          *(float *)((long)pvVar26 + lVar44 + 0x18) = fVar48;
          *(float *)((long)pvVar26 + lVar44 + 0x1c) = fStack_54;
          *(float *)((long)pvVar26 + lVar44 + 0x20) = fVar49;
          *(float *)((long)pvVar26 + lVar44 + 0x24) = fVar48;
          *(float *)((long)pvVar26 + lVar44 + 0x28) = fStack_54;
          *(float *)((long)pvVar26 + lVar44 + 0x2c) = fVar50;
          *(float *)((long)pvVar26 + lVar44 + 0x30) = local_58;
          *(float *)((long)pvVar26 + lVar44 + 0x34) = fStack_54;
          *(float *)((long)pvVar26 + lVar44 + 0x38) = fVar50;
          *(float *)((long)pvVar26 + lVar44 + 0x3c) = local_58;
          *(float *)((long)pvVar26 + lVar44 + 0x40) = fStack_54;
          *(float *)((long)pvVar26 + lVar44 + 0x44) = fVar49;
          lVar39 = (long)(int)uVar43 * 0xc;
          *(undefined8 *)((long)pvVar28 + lVar39) = 0xbf80000000000000;
          *(undefined4 *)((long)pvVar28 + lVar39 + 8) = 0;
          *(undefined8 *)((long)pvVar28 + lVar39 + 0xc) = 0xbf80000000000000;
          *(undefined4 *)((long)pvVar28 + lVar39 + 0x14) = 0;
          *(undefined8 *)((long)pvVar28 + lVar39 + 0x18) = 0xbf80000000000000;
          *(undefined4 *)((long)pvVar28 + lVar39 + 0x20) = 0;
          *(undefined8 *)((long)pvVar28 + lVar39 + 0x24) = 0xbf80000000000000;
          *(undefined4 *)((long)pvVar28 + lVar39 + 0x2c) = 0;
          *(undefined8 *)((long)pvVar28 + lVar39 + 0x30) = 0xbf80000000000000;
          *(undefined4 *)((long)pvVar28 + lVar39 + 0x38) = 0;
          *(undefined8 *)((long)pvVar28 + lVar39 + 0x3c) = 0xbf80000000000000;
          *(undefined4 *)((long)pvVar28 + lVar39 + 0x44) = 0;
          puVar1 = (undefined8 *)((long)pvVar27 + lVar46 * 8);
          *puVar1 = 0x3f00000000000000;
          puVar1[1] = 0x3f8000003f000000;
          puVar1 = (undefined8 *)((long)pvVar27 + lVar46 * 8 + 0x10);
          *puVar1 = 0x3f80000000000000;
          puVar1[1] = 0x3f00000000000000;
          puVar1 = (undefined8 *)((long)pvVar27 + lVar46 * 8 + 0x20);
          *puVar1 = 0x3f0000003f000000;
          puVar1[1] = 0x3f8000003f000000;
          *(float *)((long)pvVar26 + lVar44 + 0x48) = fVar48;
          *(undefined4 *)((long)pvVar26 + lVar44 + 0x4c) = 0;
          *(float *)((long)pvVar26 + lVar44 + 0x50) = fVar50;
          *(float *)((long)pvVar26 + lVar44 + 0x54) = fVar48;
          *(undefined4 *)((long)pvVar26 + lVar44 + 0x58) = 0;
          *(float *)((long)pvVar26 + lVar44 + 0x5c) = fVar49;
          *(float *)((long)pvVar26 + lVar44 + 0x60) = local_58;
          *(undefined4 *)((long)pvVar26 + lVar44 + 100) = 0;
          *(float *)((long)pvVar26 + lVar44 + 0x68) = fVar49;
          *(float *)((long)pvVar26 + lVar44 + 0x6c) = fVar48;
          *(undefined4 *)((long)pvVar26 + lVar44 + 0x70) = 0;
          *(float *)((long)pvVar26 + lVar44 + 0x74) = fVar50;
          *(float *)((long)pvVar26 + lVar44 + 0x78) = local_58;
          *(undefined4 *)((long)pvVar26 + lVar44 + 0x7c) = 0;
          *(float *)((long)pvVar26 + lVar44 + 0x80) = fVar49;
          *(float *)((long)pvVar26 + lVar44 + 0x84) = local_58;
          *(undefined4 *)((long)pvVar26 + lVar44 + 0x88) = 0;
          *(float *)((long)pvVar26 + lVar44 + 0x8c) = fVar50;
          uVar36 = uVar36 + 0xc;
          *(undefined8 *)((long)pvVar28 + lVar39 + 0x48) = 0x3f80000000000000;
          *(undefined4 *)((long)pvVar28 + lVar39 + 0x50) = 0;
          *(undefined8 *)((long)pvVar28 + lVar39 + 0x54) = 0x3f80000000000000;
          *(undefined4 *)((long)pvVar28 + lVar39 + 0x5c) = 0;
          *(undefined8 *)((long)pvVar28 + lVar39 + 0x60) = 0x3f80000000000000;
          *(undefined4 *)((long)pvVar28 + lVar39 + 0x68) = 0;
          *(undefined8 *)((long)pvVar28 + lVar39 + 0x6c) = 0x3f80000000000000;
          *(undefined4 *)((long)pvVar28 + lVar39 + 0x74) = 0;
          *(undefined8 *)((long)pvVar28 + lVar39 + 0x78) = 0x3f80000000000000;
          *(undefined4 *)((long)pvVar28 + lVar39 + 0x80) = 0;
          *(undefined8 *)((long)pvVar28 + lVar39 + 0x84) = 0x3f80000000000000;
          *(undefined4 *)((long)pvVar28 + lVar39 + 0x8c) = 0;
          uVar43 = uVar43 + 0xc;
          puVar1 = (undefined8 *)((long)pvVar27 + lVar46 * 8 + 0x30);
          *puVar1 = 0x3f0000003f800000;
          puVar1[1] = 0x3f8000003f800000;
          puVar1 = (undefined8 *)((long)pvVar27 + lVar46 * 8 + 0x40);
          *puVar1 = 0x3f8000003f000000;
          puVar1[1] = 0x3f0000003f800000;
          puVar1 = (undefined8 *)((long)pvVar27 + lVar46 * 8 + 0x50);
          *puVar1 = 0x3f8000003f000000;
          puVar1[1] = 0x3f0000003f000000;
          local_2e8 = (ulong)((int)local_2e8 + 0xc);
        }
      }
      else if ((((&prVar25[uVar42].r)[lVar44] == 0xff) && ((&prVar25[uVar42].g)[lVar44] == 0xff)) &&
              ((&prVar25[uVar42].b)[lVar44] == 0xff)) {
        lVar44 = (long)(int)uVar36 * 0xc;
        *(float *)((long)pvVar26 + lVar44) = fVar48;
        *(float *)((long)pvVar26 + lVar44 + 4) = fStack_54;
        *(float *)((long)pvVar26 + lVar44 + 8) = fVar50;
        *(float *)((long)pvVar26 + lVar44 + 0xc) = fVar48;
        *(float *)((long)pvVar26 + lVar44 + 0x10) = fStack_54;
        *(float *)((long)pvVar26 + lVar44 + 0x14) = fVar49;
        *(float *)((long)pvVar26 + lVar44 + 0x18) = local_58;
        *(float *)((long)pvVar26 + lVar44 + 0x1c) = fStack_54;
        *(float *)((long)pvVar26 + lVar44 + 0x20) = fVar49;
        *(float *)((long)pvVar26 + lVar44 + 0x24) = fVar48;
        *(float *)((long)pvVar26 + lVar44 + 0x28) = fStack_54;
        *(float *)((long)pvVar26 + lVar44 + 0x2c) = fVar50;
        *(float *)((long)pvVar26 + lVar44 + 0x30) = local_58;
        *(float *)((long)pvVar26 + lVar44 + 0x34) = fStack_54;
        *(float *)((long)pvVar26 + lVar44 + 0x38) = fVar49;
        *(float *)((long)pvVar26 + lVar44 + 0x3c) = local_58;
        *(float *)((long)pvVar26 + lVar44 + 0x40) = fStack_54;
        *(float *)((long)pvVar26 + lVar44 + 0x44) = fVar50;
        lVar39 = (long)(int)uVar43 * 0xc;
        *(undefined8 *)((long)pvVar28 + lVar39) = 0x3f80000000000000;
        *(undefined4 *)((long)pvVar28 + lVar39 + 8) = 0;
        *(undefined8 *)((long)pvVar28 + lVar39 + 0xc) = 0x3f80000000000000;
        *(undefined4 *)((long)pvVar28 + lVar39 + 0x14) = 0;
        *(undefined8 *)((long)pvVar28 + lVar39 + 0x18) = 0x3f80000000000000;
        *(undefined4 *)((long)pvVar28 + lVar39 + 0x20) = 0;
        *(undefined8 *)((long)pvVar28 + lVar39 + 0x24) = 0x3f80000000000000;
        *(undefined4 *)((long)pvVar28 + lVar39 + 0x2c) = 0;
        *(undefined8 *)((long)pvVar28 + lVar39 + 0x30) = 0x3f80000000000000;
        *(undefined4 *)((long)pvVar28 + lVar39 + 0x38) = 0;
        *(undefined8 *)((long)pvVar28 + lVar39 + 0x3c) = 0x3f80000000000000;
        *(undefined4 *)((long)pvVar28 + lVar39 + 0x44) = 0;
        puVar1 = (undefined8 *)((long)pvVar27 + lVar46 * 8);
        *puVar1 = 0x3f00000000000000;
        puVar1[1] = 0x3f80000000000000;
        puVar1 = (undefined8 *)((long)pvVar27 + lVar46 * 8 + 0x10);
        *puVar1 = 0x3f8000003f000000;
        puVar1[1] = 0x3f00000000000000;
        puVar1 = (undefined8 *)((long)pvVar27 + lVar46 * 8 + 0x20);
        *puVar1 = 0x3f8000003f000000;
        puVar1[1] = 0x3f0000003f000000;
        *(float *)((long)pvVar26 + lVar44 + 0x48) = fVar48;
        *(undefined4 *)((long)pvVar26 + lVar44 + 0x4c) = 0;
        *(float *)((long)pvVar26 + lVar44 + 0x50) = fVar50;
        *(float *)((long)pvVar26 + lVar44 + 0x54) = local_58;
        *(undefined4 *)((long)pvVar26 + lVar44 + 0x58) = 0;
        *(float *)((long)pvVar26 + lVar44 + 0x5c) = fVar49;
        *(float *)((long)pvVar26 + lVar44 + 0x60) = fVar48;
        *(undefined4 *)((long)pvVar26 + lVar44 + 100) = 0;
        *(float *)((long)pvVar26 + lVar44 + 0x68) = fVar49;
        *(float *)((long)pvVar26 + lVar44 + 0x6c) = fVar48;
        *(undefined4 *)((long)pvVar26 + lVar44 + 0x70) = 0;
        *(float *)((long)pvVar26 + lVar44 + 0x74) = fVar50;
        *(float *)((long)pvVar26 + lVar44 + 0x78) = local_58;
        *(undefined4 *)((long)pvVar26 + lVar44 + 0x7c) = 0;
        *(float *)((long)pvVar26 + lVar44 + 0x80) = fVar50;
        *(float *)((long)pvVar26 + lVar44 + 0x84) = local_58;
        *(undefined4 *)((long)pvVar26 + lVar44 + 0x88) = 0;
        *(float *)((long)pvVar26 + lVar44 + 0x8c) = fVar49;
        uVar38 = uVar36 + 0xc;
        *(undefined8 *)((long)pvVar28 + lVar39 + 0x48) = 0xbf80000000000000;
        *(undefined4 *)((long)pvVar28 + lVar39 + 0x50) = 0;
        *(undefined8 *)((long)pvVar28 + lVar39 + 0x54) = 0xbf80000000000000;
        *(undefined4 *)((long)pvVar28 + lVar39 + 0x5c) = 0;
        *(undefined8 *)((long)pvVar28 + lVar39 + 0x60) = 0xbf80000000000000;
        *(undefined4 *)((long)pvVar28 + lVar39 + 0x68) = 0;
        *(undefined8 *)((long)pvVar28 + lVar39 + 0x6c) = 0xbf80000000000000;
        *(undefined4 *)((long)pvVar28 + lVar39 + 0x74) = 0;
        *(undefined8 *)((long)pvVar28 + lVar39 + 0x78) = 0xbf80000000000000;
        *(undefined4 *)((long)pvVar28 + lVar39 + 0x80) = 0;
        *(undefined8 *)((long)pvVar28 + lVar39 + 0x84) = 0xbf80000000000000;
        *(undefined4 *)((long)pvVar28 + lVar39 + 0x8c) = 0;
        uVar41 = uVar43 + 0xc;
        puVar1 = (undefined8 *)((long)pvVar27 + lVar46 * 8 + 0x30);
        *puVar1 = 0x3f0000003f800000;
        puVar1[1] = 0x3f8000003f000000;
        puVar1 = (undefined8 *)((long)pvVar27 + lVar46 * 8 + 0x40);
        *puVar1 = 0x3f8000003f800000;
        puVar1[1] = 0x3f0000003f800000;
        puVar1 = (undefined8 *)((long)pvVar27 + lVar46 * 8 + 0x50);
        *puVar1 = 0x3f0000003f000000;
        puVar1[1] = 0x3f8000003f000000;
        uVar40 = (int)local_2e8 + 0xc;
        if ((((long)uVar33 < (long)((long)cubicmap.height - 1U)) &&
            (lVar34 = cubicmap.width * local_2a8, (&prVar25[uVar42].r)[lVar34] == '\0')) &&
           ((&prVar25[uVar42].g)[lVar34] == '\0')) {
          bVar47 = (&prVar25[uVar42].b)[lVar34] == '\0';
        }
        else {
          bVar47 = uVar33 == (long)cubicmap.height - 1U;
        }
        if (bVar47) {
          lVar34 = (long)(int)uVar38 * 0xc;
          *(float *)((long)pvVar26 + lVar34) = fVar48;
          *(float *)((long)pvVar26 + lVar34 + 4) = fStack_54;
          *(float *)((long)pvVar26 + lVar34 + 8) = fVar49;
          *(float *)((long)pvVar26 + lVar44 + 0x9c) = fVar48;
          *(undefined4 *)((long)pvVar26 + lVar44 + 0xa0) = 0;
          *(float *)((long)pvVar26 + lVar44 + 0xa4) = fVar49;
          *(float *)((long)pvVar26 + lVar44 + 0xa8) = local_58;
          *(float *)((long)pvVar26 + lVar44 + 0xac) = fStack_54;
          *(float *)((long)pvVar26 + lVar44 + 0xb0) = fVar49;
          *(float *)((long)pvVar26 + lVar44 + 0xb4) = local_58;
          *(float *)((long)pvVar26 + lVar44 + 0xb8) = fStack_54;
          *(float *)((long)pvVar26 + lVar44 + 0xbc) = fVar49;
          *(float *)((long)pvVar26 + lVar44 + 0xc0) = fVar48;
          *(undefined4 *)((long)pvVar26 + lVar44 + 0xc4) = 0;
          *(float *)((long)pvVar26 + lVar44 + 200) = fVar49;
          *(float *)((long)pvVar26 + lVar44 + 0xcc) = local_58;
          *(undefined4 *)((long)pvVar26 + lVar44 + 0xd0) = 0;
          *(float *)((long)pvVar26 + lVar44 + 0xd4) = fVar49;
          uVar38 = uVar36 + 0x12;
          *(undefined4 *)((long)pvVar28 + (long)(int)uVar41 * 0xc + 8) = 0xbf800000;
          *(undefined8 *)((long)pvVar28 + (long)(int)uVar41 * 0xc) = 0;
          *(undefined4 *)((long)pvVar28 + lVar39 + 0xa4) = 0xbf800000;
          *(undefined8 *)((long)pvVar28 + lVar39 + 0x9c) = 0;
          *(undefined4 *)((long)pvVar28 + lVar39 + 0xb0) = 0xbf800000;
          *(undefined8 *)((long)pvVar28 + lVar39 + 0xa8) = 0;
          *(undefined4 *)((long)pvVar28 + lVar39 + 0xbc) = 0xbf800000;
          *(undefined8 *)((long)pvVar28 + lVar39 + 0xb4) = 0;
          *(undefined4 *)((long)pvVar28 + lVar39 + 200) = 0xbf800000;
          *(undefined8 *)((long)pvVar28 + lVar39 + 0xc0) = 0;
          *(undefined4 *)((long)pvVar28 + lVar39 + 0xd4) = 0xbf800000;
          *(undefined8 *)((long)pvVar28 + lVar39 + 0xcc) = 0;
          *(undefined8 *)((long)pvVar27 + (long)(int)uVar40 * 8) = 0;
          uVar41 = uVar43 + 0x12;
          puVar1 = (undefined8 *)((long)pvVar27 + lVar46 * 8 + 0x68);
          *puVar1 = 0x3f00000000000000;
          puVar1[1] = 0x3f000000;
          puVar1 = (undefined8 *)((long)pvVar27 + lVar46 * 8 + 0x78);
          *puVar1 = 0x3f000000;
          puVar1[1] = 0x3f00000000000000;
          *(undefined8 *)((long)pvVar27 + lVar46 * 8 + 0x88) = 0x3f0000003f000000;
          uVar40 = (int)local_2e8 + 0x12;
        }
        local_2e8 = (ulong)uVar40;
        lVar44 = (long)cubicmap.width;
        if ((uVar33 == 0) ||
           (((lVar46 = lVar37 * lVar44, (&prVar25[uVar42].r)[lVar46] == '\0' &&
             ((&prVar25[uVar42].g)[lVar46] == '\0')) && ((&prVar25[uVar42].b)[lVar46] == '\0')))) {
          lVar46 = (long)(int)uVar38 * 0xc;
          *(float *)((long)pvVar26 + lVar46) = fVar48;
          *(float *)((long)pvVar26 + lVar46 + 4) = fStack_54;
          *(float *)((long)pvVar26 + lVar46 + 8) = fVar50;
          *(float *)((long)pvVar26 + lVar46 + 0xc) = local_58;
          *(undefined4 *)((long)pvVar26 + lVar46 + 0x10) = 0;
          *(float *)((long)pvVar26 + lVar46 + 0x14) = fVar50;
          *(float *)((long)pvVar26 + lVar46 + 0x18) = fVar48;
          *(undefined4 *)((long)pvVar26 + lVar46 + 0x1c) = 0;
          *(float *)((long)pvVar26 + lVar46 + 0x20) = fVar50;
          *(float *)((long)pvVar26 + lVar46 + 0x24) = fVar48;
          *(float *)((long)pvVar26 + lVar46 + 0x28) = fStack_54;
          *(float *)((long)pvVar26 + lVar46 + 0x2c) = fVar50;
          *(float *)((long)pvVar26 + lVar46 + 0x30) = local_58;
          *(float *)((long)pvVar26 + lVar46 + 0x34) = fStack_54;
          *(float *)((long)pvVar26 + lVar46 + 0x38) = fVar50;
          *(float *)((long)pvVar26 + lVar46 + 0x3c) = local_58;
          *(undefined4 *)((long)pvVar26 + lVar46 + 0x40) = 0;
          *(float *)((long)pvVar26 + lVar46 + 0x44) = fVar50;
          lVar46 = (long)(int)uVar41 * 0xc;
          *(undefined8 *)((long)pvVar28 + lVar46) = 0;
          *(undefined4 *)((long)pvVar28 + lVar46 + 8) = 0x3f800000;
          *(undefined8 *)((long)pvVar28 + lVar46 + 0xc) = 0;
          *(undefined4 *)((long)pvVar28 + lVar46 + 0x14) = 0x3f800000;
          *(undefined8 *)((long)pvVar28 + lVar46 + 0x18) = 0;
          *(undefined4 *)((long)pvVar28 + lVar46 + 0x20) = 0x3f800000;
          *(undefined8 *)((long)pvVar28 + lVar46 + 0x24) = 0;
          *(undefined4 *)((long)pvVar28 + lVar46 + 0x2c) = 0x3f800000;
          *(undefined8 *)((long)pvVar28 + lVar46 + 0x30) = 0;
          *(undefined4 *)((long)pvVar28 + lVar46 + 0x38) = 0x3f800000;
          *(undefined8 *)((long)pvVar28 + lVar46 + 0x3c) = 0;
          uVar38 = uVar38 + 6;
          *(undefined4 *)((long)pvVar28 + lVar46 + 0x44) = 0x3f800000;
          uVar41 = uVar41 + 6;
          lVar46 = (long)(int)uVar40;
          puVar1 = (undefined8 *)((long)pvVar27 + lVar46 * 8);
          *puVar1 = 0x3f800000;
          puVar1[1] = 0x3f0000003f000000;
          puVar1 = (undefined8 *)((long)pvVar27 + lVar46 * 8 + 0x10);
          *puVar1 = 0x3f0000003f800000;
          puVar1[1] = 0x3f800000;
          puVar1 = (undefined8 *)((long)pvVar27 + lVar46 * 8 + 0x20);
          *puVar1 = 0x3f000000;
          puVar1[1] = 0x3f0000003f000000;
          local_2e8 = (ulong)(uVar40 + 6);
        }
        uVar36 = uVar38;
        uVar43 = uVar41;
        if ((((long)uVar42 < (long)(lVar44 - 1U)) &&
            (lVar46 = uVar29 * lVar44, (&prVar25[uVar42 + 1].r)[lVar46] == '\0')) &&
           ((&prVar25[uVar42 + 1].g)[lVar46] == '\0')) {
          if ((&prVar25[uVar42 + 1].b)[lVar46] == '\0') {
LAB_00143dc6:
            lVar46 = (long)(int)uVar38 * 0xc;
            *(float *)((long)pvVar26 + lVar46) = local_58;
            *(float *)((long)pvVar26 + lVar46 + 4) = fStack_54;
            *(float *)((long)pvVar26 + lVar46 + 8) = fVar49;
            *(float *)((long)pvVar26 + lVar46 + 0xc) = local_58;
            *(undefined4 *)((long)pvVar26 + lVar46 + 0x10) = 0;
            *(float *)((long)pvVar26 + lVar46 + 0x14) = fVar49;
            *(float *)((long)pvVar26 + lVar46 + 0x18) = local_58;
            *(float *)((long)pvVar26 + lVar46 + 0x1c) = fStack_54;
            *(float *)((long)pvVar26 + lVar46 + 0x20) = fVar50;
            *(float *)((long)pvVar26 + lVar46 + 0x24) = local_58;
            *(float *)((long)pvVar26 + lVar46 + 0x28) = fStack_54;
            *(float *)((long)pvVar26 + lVar46 + 0x2c) = fVar50;
            *(float *)((long)pvVar26 + lVar46 + 0x30) = local_58;
            *(undefined4 *)((long)pvVar26 + lVar46 + 0x34) = 0;
            *(float *)((long)pvVar26 + lVar46 + 0x38) = fVar49;
            *(float *)((long)pvVar26 + lVar46 + 0x3c) = local_58;
            *(undefined4 *)((long)pvVar26 + lVar46 + 0x40) = 0;
            *(float *)((long)pvVar26 + lVar46 + 0x44) = fVar50;
            lVar46 = (long)(int)uVar41 * 0xc;
            *(undefined4 *)((long)pvVar28 + lVar46 + 8) = 0;
            *(undefined8 *)((long)pvVar28 + lVar46) = 0x3f800000;
            *(undefined4 *)((long)pvVar28 + lVar46 + 0x14) = 0;
            *(undefined8 *)((long)pvVar28 + lVar46 + 0xc) = 0x3f800000;
            *(undefined4 *)((long)pvVar28 + lVar46 + 0x20) = 0;
            *(undefined8 *)((long)pvVar28 + lVar46 + 0x18) = 0x3f800000;
            *(undefined4 *)((long)pvVar28 + lVar46 + 0x2c) = 0;
            *(undefined8 *)((long)pvVar28 + lVar46 + 0x24) = 0x3f800000;
            *(undefined4 *)((long)pvVar28 + lVar46 + 0x38) = 0;
            *(undefined8 *)((long)pvVar28 + lVar46 + 0x30) = 0x3f800000;
            *(undefined4 *)((long)pvVar28 + lVar46 + 0x44) = 0;
            *(undefined8 *)((long)pvVar28 + lVar46 + 0x3c) = 0x3f800000;
            lVar46 = (long)(int)local_2e8;
            puVar1 = (undefined8 *)((long)pvVar27 + lVar46 * 8);
            *puVar1 = 0;
            puVar1[1] = 0x3f00000000000000;
            puVar1 = (undefined8 *)((long)pvVar27 + lVar46 * 8 + 0x10);
            *puVar1 = 0x3f000000;
            puVar1[1] = 0x3f000000;
            puVar1 = (undefined8 *)((long)pvVar27 + lVar46 * 8 + 0x20);
            *puVar1 = 0x3f00000000000000;
            puVar1[1] = 0x3f0000003f000000;
            local_2e8 = (ulong)((int)local_2e8 + 6);
            uVar36 = uVar38 + 6;
            uVar43 = uVar41 + 6;
          }
        }
        else if (uVar42 == lVar44 - 1U) goto LAB_00143dc6;
        if ((uVar42 == 0) ||
           ((((&prVar25[uVar42 - 1].r)[uVar29 * lVar44] == '\0' &&
             (*(char *)((long)prVar25 + uVar42 * 4 + lVar44 * uVar29 + -3) == '\0')) &&
            (*(char *)((long)prVar25 + uVar42 * 4 + lVar44 * uVar29 + -2) == '\0')))) {
          lVar44 = (long)(int)uVar36 * 0xc;
          *(float *)((long)pvVar26 + lVar44) = fVar48;
          *(float *)((long)pvVar26 + lVar44 + 4) = fStack_54;
          *(float *)((long)pvVar26 + lVar44 + 8) = fVar50;
          *(float *)((long)pvVar26 + lVar44 + 0xc) = fVar48;
          *(undefined4 *)((long)pvVar26 + lVar44 + 0x10) = 0;
          *(float *)((long)pvVar26 + lVar44 + 0x14) = fVar49;
          *(float *)((long)pvVar26 + lVar44 + 0x18) = fVar48;
          *(float *)((long)pvVar26 + lVar44 + 0x1c) = fStack_54;
          *(float *)((long)pvVar26 + lVar44 + 0x20) = fVar49;
          *(float *)((long)pvVar26 + lVar44 + 0x24) = fVar48;
          *(float *)((long)pvVar26 + lVar44 + 0x28) = fStack_54;
          *(float *)((long)pvVar26 + lVar44 + 0x2c) = fVar50;
          *(float *)((long)pvVar26 + lVar44 + 0x30) = fVar48;
          *(undefined4 *)((long)pvVar26 + lVar44 + 0x34) = 0;
          *(float *)((long)pvVar26 + lVar44 + 0x38) = fVar50;
          *(float *)((long)pvVar26 + lVar44 + 0x3c) = fVar48;
          *(undefined4 *)((long)pvVar26 + lVar44 + 0x40) = 0;
          *(float *)((long)pvVar26 + lVar44 + 0x44) = fVar49;
          lVar44 = (long)(int)uVar43 * 0xc;
          *(undefined4 *)((long)pvVar28 + lVar44 + 8) = 0;
          *(undefined8 *)((long)pvVar28 + lVar44) = 0xbf800000;
          *(undefined4 *)((long)pvVar28 + lVar44 + 0x14) = 0;
          *(undefined8 *)((long)pvVar28 + lVar44 + 0xc) = 0xbf800000;
          *(undefined4 *)((long)pvVar28 + lVar44 + 0x20) = 0;
          *(undefined8 *)((long)pvVar28 + lVar44 + 0x18) = 0xbf800000;
          *(undefined4 *)((long)pvVar28 + lVar44 + 0x2c) = 0;
          *(undefined8 *)((long)pvVar28 + lVar44 + 0x24) = 0xbf800000;
          *(undefined4 *)((long)pvVar28 + lVar44 + 0x38) = 0;
          *(undefined8 *)((long)pvVar28 + lVar44 + 0x30) = 0xbf800000;
          *(undefined4 *)((long)pvVar28 + lVar44 + 0x44) = 0;
          uVar36 = uVar36 + 6;
          *(undefined8 *)((long)pvVar28 + lVar44 + 0x3c) = 0xbf800000;
          uVar43 = uVar43 + 6;
          lVar44 = (long)(int)local_2e8;
          puVar1 = (undefined8 *)((long)pvVar27 + lVar44 * 8);
          *puVar1 = 0x3f000000;
          puVar1[1] = 0x3f0000003f800000;
          puVar1 = (undefined8 *)((long)pvVar27 + lVar44 * 8 + 0x10);
          *puVar1 = 0x3f800000;
          puVar1[1] = 0x3f000000;
          puVar1 = (undefined8 *)((long)pvVar27 + lVar44 * 8 + 0x20);
          *puVar1 = 0x3f0000003f000000;
          puVar1[1] = 0x3f0000003f800000;
          local_2e8 = (ulong)((int)local_2e8 + 6);
        }
      }
    }
    uVar29 = uVar29 + 4;
    local_2a8 = local_2a8 + 4;
    lVar37 = lVar37 + 4;
    uVar33 = uVar33 + 1;
  } while( true );
}

Assistant:

RF_API rf_mesh rf_gen_mesh_cubicmap(rf_image cubicmap, rf_vec3 cube_size, rf_allocator allocator, rf_allocator temp_allocator)
{
    rf_mesh mesh = {0};
    mesh.vbo_id = (unsigned int*) RF_ALLOC(allocator, RF_MAX_MESH_VBO * sizeof(unsigned int));
    memset(mesh.vbo_id, 0, RF_MAX_MESH_VBO * sizeof(unsigned int));

    rf_color* cubicmap_pixels = rf_image_pixels_to_rgba32(cubicmap, temp_allocator);

    int map_width = cubicmap.width;
    int map_height = cubicmap.height;

    // NOTE: Max possible number of triangles numCubes*(12 triangles by cube)
    int maxTriangles = cubicmap.width*cubicmap.height*12;

    int vertex_pos_counter = 0; // Used to count vertices
    int vertex_texcoord_counter = 0; // Used to count texcoords
    int n_counter = 0; // Used to count normals

    float w = cube_size.x;
    float h = cube_size.z;
    float h2 = cube_size.y;

    rf_vec3* map_vertices  = (rf_vec3*) RF_ALLOC(temp_allocator, maxTriangles * 3 * sizeof(rf_vec3));
    rf_vec2 *map_texcoords = (rf_vec2*) RF_ALLOC(temp_allocator, maxTriangles * 3 * sizeof(rf_vec2));
    rf_vec3* map_normals   = (rf_vec3*) RF_ALLOC(temp_allocator, maxTriangles * 3 * sizeof(rf_vec3));

    // Define the 6 normals of the cube, we will combine them accordingly later...
    rf_vec3 n1 = {  1.0f,  0.0f,  0.0f };
    rf_vec3 n2 = { -1.0f,  0.0f,  0.0f };
    rf_vec3 n3 = {  0.0f,  1.0f,  0.0f };
    rf_vec3 n4 = {  0.0f, -1.0f,  0.0f };
    rf_vec3 n5 = {  0.0f,  0.0f,  1.0f };
    rf_vec3 n6 = {  0.0f,  0.0f, -1.0f };

    // NOTE: We use texture rectangles to define different textures for top-bottom-front-back-right-left (6)
    typedef struct rf_recf rf_recf;
    struct rf_recf
    {
        float x;
        float y;
        float width;
        float height;
    };

    rf_recf right_tex_uv  = { 0.0f, 0.0f, 0.5f, 0.5f };
    rf_recf left_tex_uv   = { 0.5f, 0.0f, 0.5f, 0.5f };
    rf_recf front_tex_uv  = { 0.0f, 0.0f, 0.5f, 0.5f };
    rf_recf back_tex_uv   = { 0.5f, 0.0f, 0.5f, 0.5f };
    rf_recf top_tex_uv    = { 0.0f, 0.5f, 0.5f, 0.5f };
    rf_recf bottom_tex_uv = { 0.5f, 0.5f, 0.5f, 0.5f };

    for (rf_int z = 0; z < map_height; ++z)
    {
        for (rf_int x = 0; x < map_width; ++x)
        {
            // Define the 8 vertex of the cube, we will combine them accordingly later...
            rf_vec3 v1 = {w * (x - 0.5f), h2, h * (z - 0.5f) };
            rf_vec3 v2 = {w * (x - 0.5f), h2, h * (z + 0.5f) };
            rf_vec3 v3 = {w * (x + 0.5f), h2, h * (z + 0.5f) };
            rf_vec3 v4 = {w * (x + 0.5f), h2, h * (z - 0.5f) };
            rf_vec3 v5 = {w * (x + 0.5f), 0, h * (z - 0.5f) };
            rf_vec3 v6 = {w * (x - 0.5f), 0, h * (z - 0.5f) };
            rf_vec3 v7 = {w * (x - 0.5f), 0, h * (z + 0.5f) };
            rf_vec3 v8 = {w * (x + 0.5f), 0, h * (z + 0.5f) };

            // We check pixel color to be RF_WHITE, we will full cubes
            if ((cubicmap_pixels[z*cubicmap.width + x].r == 255) &&
                (cubicmap_pixels[z*cubicmap.width + x].g == 255) &&
                (cubicmap_pixels[z*cubicmap.width + x].b == 255))
            {
                // Define triangles (Checking Collateral Cubes!)
                //----------------------------------------------

                // Define top triangles (2 tris, 6 vertex --> v1-v2-v3, v1-v3-v4)
                map_vertices[vertex_pos_counter] = v1;
                map_vertices[vertex_pos_counter + 1] = v2;
                map_vertices[vertex_pos_counter + 2] = v3;
                map_vertices[vertex_pos_counter + 3] = v1;
                map_vertices[vertex_pos_counter + 4] = v3;
                map_vertices[vertex_pos_counter + 5] = v4;
                vertex_pos_counter += 6;

                map_normals[n_counter] = n3;
                map_normals[n_counter + 1] = n3;
                map_normals[n_counter + 2] = n3;
                map_normals[n_counter + 3] = n3;
                map_normals[n_counter + 4] = n3;
                map_normals[n_counter + 5] = n3;
                n_counter += 6;

                map_texcoords[vertex_texcoord_counter] = (rf_vec2){top_tex_uv.x, top_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 1] = (rf_vec2){top_tex_uv.x, top_tex_uv.y + top_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 2] = (rf_vec2){top_tex_uv.x + top_tex_uv.width, top_tex_uv.y + top_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 3] = (rf_vec2){top_tex_uv.x, top_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 4] = (rf_vec2){top_tex_uv.x + top_tex_uv.width, top_tex_uv.y + top_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 5] = (rf_vec2){top_tex_uv.x + top_tex_uv.width, top_tex_uv.y };
                vertex_texcoord_counter += 6;

                // Define bottom triangles (2 tris, 6 vertex --> v6-v8-v7, v6-v5-v8)
                map_vertices[vertex_pos_counter] = v6;
                map_vertices[vertex_pos_counter + 1] = v8;
                map_vertices[vertex_pos_counter + 2] = v7;
                map_vertices[vertex_pos_counter + 3] = v6;
                map_vertices[vertex_pos_counter + 4] = v5;
                map_vertices[vertex_pos_counter + 5] = v8;
                vertex_pos_counter += 6;

                map_normals[n_counter] = n4;
                map_normals[n_counter + 1] = n4;
                map_normals[n_counter + 2] = n4;
                map_normals[n_counter + 3] = n4;
                map_normals[n_counter + 4] = n4;
                map_normals[n_counter + 5] = n4;
                n_counter += 6;

                map_texcoords[vertex_texcoord_counter] = (rf_vec2){bottom_tex_uv.x + bottom_tex_uv.width, bottom_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 1] = (rf_vec2){bottom_tex_uv.x, bottom_tex_uv.y + bottom_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 2] = (rf_vec2){bottom_tex_uv.x + bottom_tex_uv.width, bottom_tex_uv.y + bottom_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 3] = (rf_vec2){bottom_tex_uv.x + bottom_tex_uv.width, bottom_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 4] = (rf_vec2){bottom_tex_uv.x, bottom_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 5] = (rf_vec2){bottom_tex_uv.x, bottom_tex_uv.y + bottom_tex_uv.height };
                vertex_texcoord_counter += 6;

                if (((z < cubicmap.height - 1) &&
                     (cubicmap_pixels[(z + 1)*cubicmap.width + x].r == 0) &&
                     (cubicmap_pixels[(z + 1)*cubicmap.width + x].g == 0) &&
                     (cubicmap_pixels[(z + 1)*cubicmap.width + x].b == 0)) || (z == cubicmap.height - 1))
                {
                    // Define front triangles (2 tris, 6 vertex) --> v2 v7 v3, v3 v7 v8
                    // NOTE: Collateral occluded faces are not generated
                    map_vertices[vertex_pos_counter] = v2;
                    map_vertices[vertex_pos_counter + 1] = v7;
                    map_vertices[vertex_pos_counter + 2] = v3;
                    map_vertices[vertex_pos_counter + 3] = v3;
                    map_vertices[vertex_pos_counter + 4] = v7;
                    map_vertices[vertex_pos_counter + 5] = v8;
                    vertex_pos_counter += 6;

                    map_normals[n_counter] = n6;
                    map_normals[n_counter + 1] = n6;
                    map_normals[n_counter + 2] = n6;
                    map_normals[n_counter + 3] = n6;
                    map_normals[n_counter + 4] = n6;
                    map_normals[n_counter + 5] = n6;
                    n_counter += 6;

                    map_texcoords[vertex_texcoord_counter] = (rf_vec2){front_tex_uv.x, front_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 1] = (rf_vec2){front_tex_uv.x, front_tex_uv.y + front_tex_uv.height };
                    map_texcoords[vertex_texcoord_counter + 2] = (rf_vec2){front_tex_uv.x + front_tex_uv.width, front_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 3] = (rf_vec2){front_tex_uv.x + front_tex_uv.width, front_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 4] = (rf_vec2){front_tex_uv.x, front_tex_uv.y + front_tex_uv.height };
                    map_texcoords[vertex_texcoord_counter + 5] = (rf_vec2){front_tex_uv.x + front_tex_uv.width, front_tex_uv.y + front_tex_uv.height };
                    vertex_texcoord_counter += 6;
                }

                if (((z > 0) &&
                     (cubicmap_pixels[(z - 1)*cubicmap.width + x].r == 0) &&
                     (cubicmap_pixels[(z - 1)*cubicmap.width + x].g == 0) &&
                     (cubicmap_pixels[(z - 1)*cubicmap.width + x].b == 0)) || (z == 0))
                {
                    // Define back triangles (2 tris, 6 vertex) --> v1 v5 v6, v1 v4 v5
                    // NOTE: Collateral occluded faces are not generated
                    map_vertices[vertex_pos_counter] = v1;
                    map_vertices[vertex_pos_counter + 1] = v5;
                    map_vertices[vertex_pos_counter + 2] = v6;
                    map_vertices[vertex_pos_counter + 3] = v1;
                    map_vertices[vertex_pos_counter + 4] = v4;
                    map_vertices[vertex_pos_counter + 5] = v5;
                    vertex_pos_counter += 6;

                    map_normals[n_counter] = n5;
                    map_normals[n_counter + 1] = n5;
                    map_normals[n_counter + 2] = n5;
                    map_normals[n_counter + 3] = n5;
                    map_normals[n_counter + 4] = n5;
                    map_normals[n_counter + 5] = n5;
                    n_counter += 6;

                    map_texcoords[vertex_texcoord_counter] = (rf_vec2){back_tex_uv.x + back_tex_uv.width, back_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 1] = (rf_vec2){back_tex_uv.x, back_tex_uv.y + back_tex_uv.height };
                    map_texcoords[vertex_texcoord_counter + 2] = (rf_vec2){back_tex_uv.x + back_tex_uv.width, back_tex_uv.y + back_tex_uv.height };
                    map_texcoords[vertex_texcoord_counter + 3] = (rf_vec2){back_tex_uv.x + back_tex_uv.width, back_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 4] = (rf_vec2){back_tex_uv.x, back_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 5] = (rf_vec2){back_tex_uv.x, back_tex_uv.y + back_tex_uv.height };
                    vertex_texcoord_counter += 6;
                }

                if (((x < cubicmap.width - 1) &&
                     (cubicmap_pixels[z*cubicmap.width + (x + 1)].r == 0) &&
                     (cubicmap_pixels[z*cubicmap.width + (x + 1)].g == 0) &&
                     (cubicmap_pixels[z*cubicmap.width + (x + 1)].b == 0)) || (x == cubicmap.width - 1))
                {
                    // Define right triangles (2 tris, 6 vertex) --> v3 v8 v4, v4 v8 v5
                    // NOTE: Collateral occluded faces are not generated
                    map_vertices[vertex_pos_counter] = v3;
                    map_vertices[vertex_pos_counter + 1] = v8;
                    map_vertices[vertex_pos_counter + 2] = v4;
                    map_vertices[vertex_pos_counter + 3] = v4;
                    map_vertices[vertex_pos_counter + 4] = v8;
                    map_vertices[vertex_pos_counter + 5] = v5;
                    vertex_pos_counter += 6;

                    map_normals[n_counter] = n1;
                    map_normals[n_counter + 1] = n1;
                    map_normals[n_counter + 2] = n1;
                    map_normals[n_counter + 3] = n1;
                    map_normals[n_counter + 4] = n1;
                    map_normals[n_counter + 5] = n1;
                    n_counter += 6;

                    map_texcoords[vertex_texcoord_counter] = (rf_vec2){right_tex_uv.x, right_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 1] = (rf_vec2){right_tex_uv.x, right_tex_uv.y + right_tex_uv.height };
                    map_texcoords[vertex_texcoord_counter + 2] = (rf_vec2){right_tex_uv.x + right_tex_uv.width, right_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 3] = (rf_vec2){right_tex_uv.x + right_tex_uv.width, right_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 4] = (rf_vec2){right_tex_uv.x, right_tex_uv.y + right_tex_uv.height };
                    map_texcoords[vertex_texcoord_counter + 5] = (rf_vec2){right_tex_uv.x + right_tex_uv.width, right_tex_uv.y + right_tex_uv.height };
                    vertex_texcoord_counter += 6;
                }

                if (((x > 0) &&
                     (cubicmap_pixels[z*cubicmap.width + (x - 1)].r == 0) &&
                     (cubicmap_pixels[z*cubicmap.width + (x - 1)].g == 0) &&
                     (cubicmap_pixels[z*cubicmap.width + (x - 1)].b == 0)) || (x == 0))
                {
                    // Define left triangles (2 tris, 6 vertex) --> v1 v7 v2, v1 v6 v7
                    // NOTE: Collateral occluded faces are not generated
                    map_vertices[vertex_pos_counter] = v1;
                    map_vertices[vertex_pos_counter + 1] = v7;
                    map_vertices[vertex_pos_counter + 2] = v2;
                    map_vertices[vertex_pos_counter + 3] = v1;
                    map_vertices[vertex_pos_counter + 4] = v6;
                    map_vertices[vertex_pos_counter + 5] = v7;
                    vertex_pos_counter += 6;

                    map_normals[n_counter] = n2;
                    map_normals[n_counter + 1] = n2;
                    map_normals[n_counter + 2] = n2;
                    map_normals[n_counter + 3] = n2;
                    map_normals[n_counter + 4] = n2;
                    map_normals[n_counter + 5] = n2;
                    n_counter += 6;

                    map_texcoords[vertex_texcoord_counter] = (rf_vec2){left_tex_uv.x, left_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 1] = (rf_vec2){left_tex_uv.x + left_tex_uv.width, left_tex_uv.y + left_tex_uv.height };
                    map_texcoords[vertex_texcoord_counter + 2] = (rf_vec2){left_tex_uv.x + left_tex_uv.width, left_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 3] = (rf_vec2){left_tex_uv.x, left_tex_uv.y };
                    map_texcoords[vertex_texcoord_counter + 4] = (rf_vec2){left_tex_uv.x, left_tex_uv.y + left_tex_uv.height };
                    map_texcoords[vertex_texcoord_counter + 5] = (rf_vec2){left_tex_uv.x + left_tex_uv.width, left_tex_uv.y + left_tex_uv.height };
                    vertex_texcoord_counter += 6;
                }
            }
                // We check pixel color to be RF_BLACK, we will only draw floor and roof
            else if ((cubicmap_pixels[z*cubicmap.width + x].r == 0) &&
                     (cubicmap_pixels[z*cubicmap.width + x].g == 0) &&
                     (cubicmap_pixels[z*cubicmap.width + x].b == 0))
            {
                // Define top triangles (2 tris, 6 vertex --> v1-v2-v3, v1-v3-v4)
                map_vertices[vertex_pos_counter] = v1;
                map_vertices[vertex_pos_counter + 1] = v3;
                map_vertices[vertex_pos_counter + 2] = v2;
                map_vertices[vertex_pos_counter + 3] = v1;
                map_vertices[vertex_pos_counter + 4] = v4;
                map_vertices[vertex_pos_counter + 5] = v3;
                vertex_pos_counter += 6;

                map_normals[n_counter] = n4;
                map_normals[n_counter + 1] = n4;
                map_normals[n_counter + 2] = n4;
                map_normals[n_counter + 3] = n4;
                map_normals[n_counter + 4] = n4;
                map_normals[n_counter + 5] = n4;
                n_counter += 6;

                map_texcoords[vertex_texcoord_counter] = (rf_vec2){top_tex_uv.x, top_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 1] = (rf_vec2){top_tex_uv.x + top_tex_uv.width, top_tex_uv.y + top_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 2] = (rf_vec2){top_tex_uv.x, top_tex_uv.y + top_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 3] = (rf_vec2){top_tex_uv.x, top_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 4] = (rf_vec2){top_tex_uv.x + top_tex_uv.width, top_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 5] = (rf_vec2){top_tex_uv.x + top_tex_uv.width, top_tex_uv.y + top_tex_uv.height };
                vertex_texcoord_counter += 6;

                // Define bottom triangles (2 tris, 6 vertex --> v6-v8-v7, v6-v5-v8)
                map_vertices[vertex_pos_counter] = v6;
                map_vertices[vertex_pos_counter + 1] = v7;
                map_vertices[vertex_pos_counter + 2] = v8;
                map_vertices[vertex_pos_counter + 3] = v6;
                map_vertices[vertex_pos_counter + 4] = v8;
                map_vertices[vertex_pos_counter + 5] = v5;
                vertex_pos_counter += 6;

                map_normals[n_counter] = n3;
                map_normals[n_counter + 1] = n3;
                map_normals[n_counter + 2] = n3;
                map_normals[n_counter + 3] = n3;
                map_normals[n_counter + 4] = n3;
                map_normals[n_counter + 5] = n3;
                n_counter += 6;

                map_texcoords[vertex_texcoord_counter] = (rf_vec2){bottom_tex_uv.x + bottom_tex_uv.width, bottom_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 1] = (rf_vec2){bottom_tex_uv.x + bottom_tex_uv.width, bottom_tex_uv.y + bottom_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 2] = (rf_vec2){bottom_tex_uv.x, bottom_tex_uv.y + bottom_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 3] = (rf_vec2){bottom_tex_uv.x + bottom_tex_uv.width, bottom_tex_uv.y };
                map_texcoords[vertex_texcoord_counter + 4] = (rf_vec2){bottom_tex_uv.x, bottom_tex_uv.y + bottom_tex_uv.height };
                map_texcoords[vertex_texcoord_counter + 5] = (rf_vec2){bottom_tex_uv.x, bottom_tex_uv.y };
                vertex_texcoord_counter += 6;
            }
        }
    }

    // Move data from map_vertices temp arays to vertices float array
    mesh.vertex_count = vertex_pos_counter;
    mesh.triangle_count = vertex_pos_counter/3;

    mesh.vertices  = (float*) RF_ALLOC(allocator, mesh.vertex_count * 3 * sizeof(float));
    mesh.normals   = (float*) RF_ALLOC(allocator, mesh.vertex_count * 3 * sizeof(float));
    mesh.texcoords = (float*) RF_ALLOC(allocator, mesh.vertex_count * 2 * sizeof(float));
    mesh.colors = NULL;

    int f_counter = 0;

    // Move vertices data
    for (rf_int i = 0; i < vertex_pos_counter; i++)
    {
        mesh.vertices[f_counter] = map_vertices[i].x;
        mesh.vertices[f_counter + 1] = map_vertices[i].y;
        mesh.vertices[f_counter + 2] = map_vertices[i].z;
        f_counter += 3;
    }

    f_counter = 0;

    // Move normals data
    for (rf_int i = 0; i < n_counter; i++)
    {
        mesh.normals[f_counter] = map_normals[i].x;
        mesh.normals[f_counter + 1] = map_normals[i].y;
        mesh.normals[f_counter + 2] = map_normals[i].z;
        f_counter += 3;
    }

    f_counter = 0;

    // Move texcoords data
    for (rf_int i = 0; i < vertex_texcoord_counter; i++)
    {
        mesh.texcoords[f_counter] = map_texcoords[i].x;
        mesh.texcoords[f_counter + 1] = map_texcoords[i].y;
        f_counter += 2;
    }

    RF_FREE(temp_allocator, map_vertices);
    RF_FREE(temp_allocator, map_normals);
    RF_FREE(temp_allocator, map_texcoords);

    RF_FREE(temp_allocator, cubicmap_pixels); // Free image pixel data

    // Upload vertex data to GPU (static mesh)
    rf_gfx_load_mesh(&mesh, false);

    return mesh;
}